

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

path * lookup_file_insensitive(path *path,string *filename,string *error_msg)

{
  bool bVar1;
  int iVar2;
  path *this;
  undefined8 uVar3;
  undefined8 uVar4;
  string *in_RCX;
  path *in_RDI;
  directory_entry *p;
  directory_iterator __end1;
  directory_iterator __begin1;
  directory_iterator *__range1;
  directory_iterator di;
  error_code ec;
  path *in_stack_fffffffffffffd18;
  undefined7 in_stack_fffffffffffffd20;
  byte in_stack_fffffffffffffd27;
  path *in_stack_fffffffffffffd28;
  path *in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd38;
  undefined4 in_stack_fffffffffffffd3c;
  string *in_stack_fffffffffffffd40;
  string *this_00;
  path *in_stack_fffffffffffffd48;
  path *this_01;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd60;
  char *in_stack_fffffffffffffd68;
  string local_280 [32];
  string local_260 [32];
  string local_240 [72];
  string local_1f8 [32];
  directory_entry *local_1d8;
  directory_iterator local_1a0;
  undefined1 local_190 [16];
  undefined1 *local_180;
  int local_174;
  string local_170 [32];
  string local_150 [32];
  string local_130 [32];
  string local_110 [48];
  string local_e0 [32];
  string local_c0 [32];
  string local_a0 [32];
  string local_80 [32];
  string local_60 [48];
  error_code local_30;
  string *local_20;
  
  this_01 = in_RDI;
  local_20 = in_RCX;
  std::error_code::error_code
            ((error_code *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
  std::filesystem::__cxx11::directory_iterator::directory_iterator
            ((directory_iterator *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
             in_stack_fffffffffffffd18,(error_code *)0x11484e);
  bVar1 = std::error_code::operator_cast_to_bool(&local_30);
  if (bVar1) {
    std::operator+(in_stack_fffffffffffffd68,in_stack_fffffffffffffd60);
    std::operator+(&in_stack_fffffffffffffd28->_M_pathname,
                   (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    std::filesystem::__cxx11::path::string(in_stack_fffffffffffffd48);
    std::__cxx11::string::c_str();
    std::operator+(&in_stack_fffffffffffffd28->_M_pathname,
                   (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    std::operator+(&in_stack_fffffffffffffd28->_M_pathname,
                   (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    std::error_code::message_abi_cxx11_
              ((error_code *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
    std::operator+(&this_01->_M_pathname,&in_RDI->_M_pathname);
    this_00 = local_60;
    std::__cxx11::string::operator=(local_20,this_00);
    std::__cxx11::string::~string(this_00);
    std::__cxx11::string::~string(local_130);
    std::__cxx11::string::~string(local_80);
    std::__cxx11::string::~string(local_a0);
    std::__cxx11::string::~string(local_110);
    std::__cxx11::string::~string(local_c0);
    std::__cxx11::string::~string(local_e0);
    this = (path *)std::__cxx11::string::c_str();
    std::filesystem::__cxx11::path::string(this);
    uVar3 = std::__cxx11::string::c_str();
    iVar2 = std::error_code::value(&local_30);
    std::error_code::message_abi_cxx11_((error_code *)CONCAT44(iVar2,in_stack_fffffffffffffd38));
    uVar4 = std::__cxx11::string::c_str();
    SDL_LogError(1,"Error looking up \'%s\' in \'%s\': %d - %s",this,uVar3,iVar2,uVar4);
    std::__cxx11::string::~string(local_170);
    std::__cxx11::string::~string(local_150);
    std::filesystem::__cxx11::path::path
              ((path *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
    local_174 = 1;
  }
  else {
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              ((directory_iterator *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               in_stack_fffffffffffffd18);
    local_180 = local_190;
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              ((directory_iterator *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (directory_iterator *)in_stack_fffffffffffffd18);
    std::filesystem::__cxx11::begin((directory_iterator *)in_stack_fffffffffffffd18);
    std::filesystem::__cxx11::directory_iterator::~directory_iterator
              ((directory_iterator *)0x114c0c);
    std::filesystem::__cxx11::directory_iterator::directory_iterator
              ((directory_iterator *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
               (directory_iterator *)in_stack_fffffffffffffd18);
    std::filesystem::__cxx11::end((directory_iterator *)in_stack_fffffffffffffd28);
    std::filesystem::__cxx11::directory_iterator::~directory_iterator
              ((directory_iterator *)0x114c43);
    while (bVar1 = std::filesystem::__cxx11::operator!=
                             ((directory_iterator *)
                              CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20),
                              (directory_iterator *)in_stack_fffffffffffffd18), bVar1) {
      local_1d8 = (directory_entry *)
                  std::filesystem::__cxx11::directory_iterator::operator*(&local_1a0);
      std::filesystem::__cxx11::directory_entry::path(local_1d8);
      std::filesystem::__cxx11::path::filename(this_01);
      std::filesystem::__cxx11::path::string(in_stack_fffffffffffffd48);
      in_stack_fffffffffffffd27 =
           compare_string_insensitive
                     (in_stack_fffffffffffffd40,
                      (string *)CONCAT44(in_stack_fffffffffffffd3c,in_stack_fffffffffffffd38));
      std::__cxx11::string::~string(local_1f8);
      std::filesystem::__cxx11::path::~path
                ((path *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
      if ((in_stack_fffffffffffffd27 & 1) != 0) {
        std::filesystem::__cxx11::directory_entry::path(local_1d8);
        std::filesystem::__cxx11::path::path(in_stack_fffffffffffffd30,in_stack_fffffffffffffd28);
        local_174 = 1;
        goto LAB_00114d97;
      }
      std::filesystem::__cxx11::directory_iterator::operator++(&local_1a0);
    }
    local_174 = 2;
LAB_00114d97:
    std::filesystem::__cxx11::directory_iterator::~directory_iterator
              ((directory_iterator *)0x114da4);
    std::filesystem::__cxx11::directory_iterator::~directory_iterator
              ((directory_iterator *)0x114db1);
    std::filesystem::__cxx11::directory_iterator::~directory_iterator
              ((directory_iterator *)0x114dbe);
    if (local_174 == 2) {
      std::operator+(&in_stack_fffffffffffffd48->_M_pathname,(char *)in_stack_fffffffffffffd40);
      std::filesystem::__cxx11::path::string(in_stack_fffffffffffffd48);
      std::operator+(&this_01->_M_pathname,&in_RDI->_M_pathname);
      std::operator+(&in_stack_fffffffffffffd28->_M_pathname,
                     (char *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
      std::__cxx11::string::operator=(local_20,local_240);
      std::__cxx11::string::~string(local_240);
      std::__cxx11::string::~string(local_260);
      std::__cxx11::string::~string((string *)&stack0xfffffffffffffd60);
      std::__cxx11::string::~string(local_280);
      std::filesystem::__cxx11::path::path
                ((path *)CONCAT17(in_stack_fffffffffffffd27,in_stack_fffffffffffffd20));
      local_174 = 1;
    }
  }
  std::filesystem::__cxx11::directory_iterator::~directory_iterator((directory_iterator *)0x114f2b);
  return this_01;
}

Assistant:

filesystem::path lookup_file_insensitive(const filesystem::path &path, const std::string &filename, std::string &error_msg) {
	std::error_code ec;
	filesystem::directory_iterator di{path, ec};

	if (ec) {
		error_msg = "Error looking up '" + filename + "' in '" + path.string().c_str() + "': " + ec.message();
		SDL_LogError(SDL_LOG_CATEGORY_ERROR, "Error looking up '%s' in '%s': %d - %s", filename.c_str(), path.string().c_str(), ec.value(), ec.message().c_str());
		return {};
	}

	for(auto& p: filesystem::directory_iterator(path)) {
		if (compare_string_insensitive(p.path().filename().string(), filename)) {
			return p.path();
		}
	}
	error_msg = filename + ": file not found in '" + path.string() + "'.";
	return {};
}